

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptNativeFloatArray::SetItem
          (JavascriptNativeFloatArray *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  TypeId TVar1;
  double in_RAX;
  double local_28;
  double dValue;
  
  local_28 = in_RAX;
  TVar1 = TrySetNativeFloatArrayItem(this,value,&local_28);
  if (TVar1 == TypeIds_ArrayLast) {
    SetItem(this,index,local_28);
  }
  else {
    JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,index,value);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeFloatArray::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        double dValue;
        TypeId typeId = this->TrySetNativeFloatArrayItem(value, &dValue);
        if (typeId == TypeIds_NativeFloatArray)
        {
            this->SetItem(index, dValue);
        }
        else
        {
            this->DirectSetItemAt(index, value);
        }
        return TRUE;
    }